

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void textfont_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  bool bVar2;
  int iVar3;
  Fl_Widget_Type *q;
  Fl_Type *pFVar4;
  Fl_Font n;
  Fl_Color c;
  int s;
  int local_34;
  undefined1 local_30 [4];
  undefined1 local_2c [4];
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])
                      (current_widget,0,&local_34,local_2c,local_30);
    if (iVar3 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      if (0xf < local_34) {
        local_34 = 0;
      }
      Fl_Choice::value(i,local_34);
    }
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      local_34 = -1;
    }
    else {
      local_34 = (int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) * -0x49249249;
    }
    if (Fl_Type::first != (Fl_Type *)0x0) {
      bVar2 = false;
      pFVar4 = Fl_Type::first;
      do {
        if (pFVar4->selected != '\0') {
          iVar3 = (*pFVar4->_vptr_Fl_Type[0x17])(pFVar4);
          if (iVar3 != 0) {
            bVar2 = true;
            (*pFVar4->_vptr_Fl_Type[0x2b])(pFVar4,1,&local_34,local_2c,local_30);
            Fl_Widget::redraw((Fl_Widget *)pFVar4[1].prev);
          }
        }
        pFVar4 = pFVar4->next;
      } while (pFVar4 != (Fl_Type *)0x0);
      if (bVar2) {
        set_modflag(1);
      }
    }
  }
  return;
}

Assistant:

void textfont_cb(Fl_Choice* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
    if (n > 15) n = FL_HELVETICA;
    i->value(n);
  } else {
    int mod = 0;
    n = (Fl_Font)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(1,n,s,c);
	q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}